

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walksymbol.c
# Opt level: O2

void walk_statement(dmr_C *C,statement *stmt,symbol_visitor *visitor)

{
  statement *stmt_00;
  statement *stmt_01;
  expression *peVar1;
  void *pvVar2;
  _func_void_void_ptr_char_ptr *p_Var3;
  undefined8 expr;
  statement *psVar4;
  symbol *psVar5;
  char *pcVar6;
  expression *peVar7;
  undefined1 local_60 [8];
  ptr_list_iter siter__;
  
  if (stmt == (statement *)0x0) {
    return;
  }
  (*visitor->begin_statement)(visitor->data,stmt->type);
  switch(stmt->type) {
  case STMT_DECLARATION:
    dmrC_walk_symbol_list(C,(symbol_list *)(stmt->field_2).field_1.expression,visitor);
    break;
  case STMT_EXPRESSION:
    peVar7 = (stmt->field_2).field_1.expression;
    goto LAB_001273a1;
  case STMT_COMPOUND:
    ptrlist_forward_iterator
              ((ptr_list_iter *)local_60,(ptr_list *)(stmt->field_2).field_1.expression);
    while (psVar4 = (statement *)ptrlist_iter_next((ptr_list_iter *)local_60),
          psVar4 != (statement *)0x0) {
      walk_statement(C,psVar4,visitor);
    }
    psVar5 = (stmt->field_2).field_2.ret_target;
    if (psVar5 == (symbol *)0x0) break;
    goto LAB_0012747f;
  case STMT_IF:
    walk_expression(C,(stmt->field_2).field_1.expression,visitor);
    (*visitor->begin_if_then)(visitor->data);
    walk_statement(C,(stmt->field_2).field_3.if_true,visitor);
    (*visitor->end_if_then)(visitor->data);
    if ((stmt->field_2).field_3.if_false != (statement *)0x0) {
      (*visitor->begin_if_else)(visitor->data);
      walk_statement(C,(stmt->field_2).field_3.if_false,visitor);
      (*visitor->end_if_else)(visitor->data);
    }
    break;
  case STMT_RETURN:
    peVar7 = (stmt->field_2).field_1.expression;
    psVar5 = (stmt->field_2).field_2.ret_target;
    if ((peVar7 != (expression *)0x0) && (peVar7->ctype != (symbol *)0x0)) {
      walk_expression(C,peVar7,visitor);
    }
    (*visitor->begin_statement)(visitor->data,STMT_GOTO);
    dmrC_walk_symbol(C,psVar5,visitor);
    (*visitor->end_statement)(visitor->data);
    break;
  case STMT_CASE:
    walk_label(C,(stmt->field_2).field_6.case_label,visitor);
    psVar4 = (stmt->field_2).field_3.if_false;
    goto LAB_001274cb;
  case STMT_SWITCH:
    walk_expression(C,(stmt->field_2).field_1.expression,visitor);
    ptrlist_forward_iterator
              ((ptr_list_iter *)local_60,
               (ptr_list *)((stmt->field_2).field_10.asm_clobbers)->list_[0xf]);
    while (psVar5 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_60), psVar5 != (symbol *)0x0)
    {
      psVar4 = (psVar5->field_14).field_2.stmt;
      peVar7 = (psVar4->field_2).field_1.expression;
      if (peVar7 == (expression *)0x0) {
        (*visitor->begin_default_case)(visitor->data);
      }
      else if (*(char *)peVar7 == '\x01') {
        peVar1 = (psVar4->field_2).field_1.context;
        if (peVar1 == (expression *)0x0) {
          (*visitor->begin_case_value)(visitor->data,(peVar7->field_5).field_0.value);
        }
        else if (*(char *)peVar1 == '\x01') {
          (*visitor->begin_case_range)
                    (visitor->data,(peVar7->field_5).field_0.value,(peVar1->field_5).field_0.value);
        }
      }
      dmrC_walk_symbol(C,psVar5,visitor);
      (*visitor->end_case)(visitor->data);
    }
    walk_statement(C,(stmt->field_2).field_3.if_true,visitor);
    psVar5 = (symbol *)(stmt->field_2).field_3.if_false;
    goto LAB_00127479;
  case STMT_ITERATOR:
    psVar4 = (stmt->field_2).field_4.args;
    peVar7 = (stmt->field_2).field_8.iterator_pre_condition;
    stmt_00 = (stmt->field_2).field_8.iterator_statement;
    stmt_01 = (stmt->field_2).field_8.iterator_post_statement;
    siter__._16_8_ = (stmt->field_2).field_8.iterator_post_condition;
    dmrC_walk_symbol_list(C,(stmt->field_2).field_8.iterator_syms,visitor);
    if (psVar4 != (statement *)0x0) {
      (*visitor->begin_iterator_prestatement)(visitor->data);
      walk_statement(C,psVar4,visitor);
      (*visitor->end_iterator_prestatement)(visitor->data);
    }
    if (peVar7 != (expression *)0x0) {
      (*visitor->begin_iterator_precondition)(visitor->data);
      walk_expression(C,peVar7,visitor);
      (*visitor->end_iterator_precondition)(visitor->data);
    }
    (*visitor->begin_iterator_statement)(visitor->data);
    walk_statement(C,stmt_00,visitor);
    (*visitor->end_iterator_statement)(visitor->data);
    expr = siter__._16_8_;
    psVar5 = (stmt->field_2).field_2.ret_target;
    if ((psVar5->field_0x2 & 2) != 0) {
      walk_label(C,psVar5,visitor);
    }
    if (stmt_01 != (statement *)0x0) {
      (*visitor->begin_iterator_poststatement)(visitor->data);
      walk_statement(C,stmt_01,visitor);
      (*visitor->end_iterator_poststatement)(visitor->data);
    }
    if (expr != 0) {
      (*visitor->begin_iterator_postcondition)(visitor->data);
      walk_expression(C,(expression *)expr,visitor);
      (*visitor->end_iterator_postcondition)(visitor->data);
    }
    psVar5 = (stmt->field_2).field_5.label_identifier;
LAB_00127479:
    if ((psVar5->field_0x2 & 2) != 0) {
LAB_0012747f:
      walk_label(C,psVar5,visitor);
    }
    break;
  case STMT_LABEL:
    pvVar2 = visitor->data;
    p_Var3 = visitor->begin_label;
    pcVar6 = dmrC_show_ident(C,((stmt->field_2).field_5.label_identifier)->ident);
    (*p_Var3)(pvVar2,pcVar6);
    dmrC_walk_symbol(C,(stmt->field_2).field_5.label_identifier,visitor);
    (*visitor->end_label)(visitor->data);
    psVar4 = (stmt->field_2).field_3.if_true;
LAB_001274cb:
    walk_statement(C,psVar4,visitor);
    break;
  case STMT_GOTO:
    peVar7 = (stmt->field_2).field_1.context;
    if (peVar7 == (expression *)0x0) {
      dmrC_walk_symbol(C,(stmt->field_2).field_5.label_identifier,visitor);
      break;
    }
LAB_001273a1:
    walk_expression(C,peVar7,visitor);
  }
  (*visitor->end_statement)(visitor->data);
  return;
}

Assistant:

void walk_statement(struct dmr_C *C, struct statement *stmt, struct symbol_visitor *visitor)
{
	if (!stmt)
		return;

	visitor->begin_statement(visitor->data, stmt->type);
	switch (stmt->type) {
	case STMT_DECLARATION:
		dmrC_walk_symbol_list(C, stmt->declaration, visitor);
		break;
	case STMT_RETURN:
		walk_return_statement(C, stmt, visitor);
		break;
	case STMT_COMPOUND: {
		struct statement *s;
		// if (stmt->inline_fn) {
		//	dmrC_show_statement(C, stmt->args);
		//	printf("\tbegin_inline \t%s\n", dmrC_show_ident(C,
		// stmt->inline_fn->ident));
		//}
		FOR_EACH_PTR(stmt->stmts, s) { walk_statement(C, s, visitor); }
		END_FOR_EACH_PTR(s);
		if (stmt->ret) {
			walk_label(C, stmt->ret, visitor);
		}
		// if (stmt->inline_fn)
		//	printf("\tend_inlined\t%s\n", dmrC_show_ident(C,
		// stmt->inline_fn->ident));
		break;
	}

	case STMT_EXPRESSION:
		walk_expression(C, stmt->expression, visitor);
		break;
	case STMT_IF: {
		struct expression *cond = stmt->if_conditional;
		walk_expression(C, cond, visitor);
		visitor->begin_if_then(visitor->data);
		walk_statement(C, stmt->if_true, visitor);
		visitor->end_if_then(visitor->data);
		if (stmt->if_false) {
			visitor->begin_if_else(visitor->data);
			walk_statement(C, stmt->if_false, visitor);
			visitor->end_if_else(visitor->data);
		}
		break;
	}
	case STMT_SWITCH:
		walk_switch_statement(C, stmt, visitor);
		break;

	case STMT_CASE:
		walk_label(C, stmt->case_label, visitor);
		walk_statement(C, stmt->case_statement, visitor);
		break;

	case STMT_ITERATOR:
		walk_iterator_statement(C, stmt, visitor);
		break;

	case STMT_NONE:
		break;

	case STMT_LABEL:
		visitor->begin_label(visitor->data, dmrC_show_ident(C, stmt->label_identifier->ident));
		dmrC_walk_symbol(C, stmt->label_identifier, visitor);
		visitor->end_label(visitor->data);
		walk_statement(C, stmt->label_statement, visitor);
		break;

	case STMT_GOTO:
		if (stmt->goto_expression) {
			walk_expression(C, stmt->goto_expression, visitor);
		} else {
			dmrC_walk_symbol(C, stmt->goto_label, visitor);
		}
		break;
	case STMT_ASM:
		// printf("\tasm( .... )\n");
		break;
	case STMT_CONTEXT: {
		// int val = dmrC_show_expression(C, stmt->expression);
		// printf("\tcontext( %d )\n", val);
		break;
	}
	case STMT_RANGE: {
		// int val = dmrC_show_expression(C, stmt->range_expression);
		// int low = dmrC_show_expression(C, stmt->range_low);
		// int high = dmrC_show_expression(C, stmt->range_high);
		// printf("\trange( %d %d-%d)\n", val, low, high);
		break;
	}
	}
	visitor->end_statement(visitor->data);
}